

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O2

void clear_list(list *list,_Bool destroy)

{
  node *pnVar1;
  node *node;
  
  pnVar1 = list->head;
  while (node = pnVar1, node != (node *)0x0) {
    pnVar1 = node->next;
    list_remove(list,node);
    if (destroy) {
      free(node);
    }
  }
  return;
}

Assistant:

static void clear_list(struct list *list, bool destroy)
{
        struct node *node = list->head;
        struct node *next = NULL;

        while (node != NULL) {
                next = node->next;

                list_remove(list, node);

                if (destroy) {
                        node_destroy(node);
                }

                node = next;
        }
}